

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strlib.cpp
# Opt level: O0

void readQuotedString(istream *is,string *str)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  ulong uVar5;
  long lVar6;
  string local_d8 [32];
  undefined4 local_b8;
  allocator local_b1;
  int endTrim;
  int local_90;
  int local_8c;
  int i;
  int digit;
  int result;
  int base;
  int maxDigits;
  allocator local_41;
  string local_40 [38];
  char local_1a;
  char local_19;
  char delim;
  string *psStack_18;
  char ch;
  string *str_local;
  istream *is_local;
  
  psStack_18 = str;
  str_local = (string *)is;
  std::__cxx11::string::operator=((string *)str,"");
  do {
    plVar4 = (long *)std::istream::get((char *)str_local);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
    bVar2 = false;
    if (bVar1) {
      iVar3 = isspace((int)local_19);
      bVar2 = iVar3 != 0;
    }
  } while (bVar2);
  uVar5 = std::ios::fail();
  if ((uVar5 & 1) == 0) {
    if ((local_19 == '\'') || (local_19 == '\"')) {
      local_1a = local_19;
      while( true ) {
        plVar4 = (long *)std::istream::get((char *)str_local);
        bVar2 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
        if (!bVar2 || local_19 == local_1a) break;
        uVar5 = std::ios::fail();
        if ((uVar5 & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_40,"Unterminated string",&local_41);
          error((string *)local_40);
          std::__cxx11::string::~string(local_40);
          std::allocator<char>::~allocator((allocator<char> *)&local_41);
        }
        if (local_19 == '\\') {
          plVar4 = (long *)std::istream::get((char *)str_local);
          uVar5 = std::ios::operator!((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
          if ((uVar5 & 1) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&maxDigits,"Unterminated string",(allocator *)((long)&base + 3));
            error((string *)&maxDigits);
            std::__cxx11::string::~string((string *)&maxDigits);
            std::allocator<char>::~allocator((allocator<char> *)((long)&base + 3));
          }
          iVar3 = isdigit((int)local_19);
          if ((iVar3 == 0) && (local_19 != 'x')) {
            switch(local_19) {
            case '\"':
              local_19 = '\"';
              break;
            case '\'':
              local_19 = '\'';
              break;
            case '\\':
              local_19 = '\\';
              break;
            case 'a':
              local_19 = '\a';
              break;
            case 'b':
              local_19 = '\b';
              break;
            case 'f':
              local_19 = '\f';
              break;
            case 'n':
              local_19 = '\n';
              break;
            case 'r':
              local_19 = '\r';
              break;
            case 't':
              local_19 = '\t';
              break;
            case 'v':
              local_19 = '\v';
            }
          }
          else {
            result = 3;
            digit = 8;
            if (local_19 == 'x') {
              digit = 0x10;
              result = 2;
            }
            i = 0;
            local_8c = 0;
            for (local_90 = 0; local_90 < result && local_19 != local_1a; local_90 = local_90 + 1) {
              iVar3 = isdigit((int)local_19);
              if (iVar3 == 0) {
                if ((digit != 0x10) || (iVar3 = isxdigit((int)local_19), iVar3 == 0)) break;
                local_8c = toupper((int)local_19);
                local_8c = local_8c + -0x37;
              }
              else {
                local_8c = local_19 + -0x30;
              }
              i = digit * i + local_8c;
              plVar4 = (long *)std::istream::get((char *)str_local);
              uVar5 = std::ios::operator!((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
              if ((uVar5 & 1) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&endTrim,"Unterminated string",&local_b1);
                error((string *)&endTrim);
                std::__cxx11::string::~string((string *)&endTrim);
                std::allocator<char>::~allocator((allocator<char> *)&local_b1);
              }
            }
            local_19 = (char)i;
            std::istream::unget();
          }
        }
        std::__cxx11::string::operator+=((string *)psStack_18,local_19);
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)psStack_18,local_19);
      local_b8 = 0;
      while( true ) {
        plVar4 = (long *)std::istream::get((char *)str_local);
        bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
        bVar2 = false;
        if (bVar1) {
          lVar6 = std::__cxx11::string::find('h',(ulong)(uint)(int)local_19);
          bVar2 = lVar6 == -1;
        }
        if (!bVar2) break;
        std::__cxx11::string::operator+=((string *)psStack_18,local_19);
        iVar3 = isspace((int)local_19);
        if (iVar3 == 0) {
          local_b8 = std::__cxx11::string::length();
        }
      }
      bVar2 = std::ios::operator_cast_to_bool
                        ((ios *)(str_local + *(long *)(*(long *)str_local + -0x18)));
      if (bVar2) {
        std::istream::unget();
      }
      std::__cxx11::string::substr((ulong)local_d8,(ulong)psStack_18);
      std::__cxx11::string::operator=((string *)psStack_18,local_d8);
      std::__cxx11::string::~string(local_d8);
    }
  }
  return;
}

Assistant:

void readQuotedString(istream & is, string & str) {
   str = "";
   char ch;
   while (is.get(ch) && isspace(ch)) {
      /* Empty */
   }
   if (is.fail()) return;
   if (ch == '\'' || ch == '"') {
      char delim = ch;
      while (is.get(ch) && ch != delim) {
         if (is.fail()) error("Unterminated string");
         if (ch == '\\') {
            if (!is.get(ch)) error("Unterminated string");
            if (isdigit(ch) || ch == 'x') {
               int maxDigits = 3;
               int base = 8;
               if (ch == 'x') {
                  base = 16;
                  maxDigits = 2;
               }
               int result = 0;
               int digit = 0;
               for (int i = 0; i < maxDigits && ch != delim; i++) {
                  if (isdigit(ch)) {
                     digit = ch - '0';
                  } else if (base == 16 && isxdigit(ch)) {
                     digit = toupper(ch) - 'A' + 10;
                  } else {
                     break;
                  }
                  result = base * result + digit;
                  if (!is.get(ch)) error("Unterminated string");
               }
               ch = char(result);
               is.unget();
            } else {
               switch (ch) {
                case 'a': ch = '\a'; break;
                case 'b': ch = '\b'; break;
                case 'f': ch = '\f'; break;
                case 'n': ch = '\n'; break;
                case 'r': ch = '\r'; break;
                case 't': ch = '\t'; break;
                case 'v': ch = '\v'; break;
                case '"': ch = '"'; break;
                case '\'': ch = '\''; break;
                case '\\': ch = '\\'; break;
               }
            }
         }
         str += ch;
      }
   } else {
      str += ch;
      int endTrim = 0;
      while (is.get(ch) && STRING_DELIMITERS.find(ch) == string::npos) {
         str += ch;
         if (!isspace(ch)) endTrim = str.length();
      }
      if (is) is.unget();
      str = str.substr(0, endTrim);
   }
}